

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O1

char * CaptureDecimalInteger(char *szDataPtr,char *szDataEnd,PDWORD PtrValue)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  pbVar2 = (byte *)szDataPtr;
  if (szDataPtr < szDataEnd) {
    do {
      szDataPtr = (char *)pbVar2;
      if (*szDataPtr != 0x20) break;
      pbVar2 = (byte *)szDataPtr + 1;
      szDataPtr = szDataEnd;
    } while (pbVar2 != (byte *)szDataEnd);
  }
  uVar3 = 0;
  pbVar2 = (byte *)szDataPtr;
  if (szDataPtr < szDataEnd) {
    lVar4 = (long)szDataEnd - (long)szDataPtr;
    uVar3 = 0;
    do {
      bVar1 = *szDataPtr;
      pbVar2 = (byte *)szDataPtr;
      if (bVar1 == 0x20) break;
      if ((9 < (byte)(bVar1 - 0x30)) || (uVar5 = bVar1 - 0x30, CARRY4(uVar3,uVar5))) {
        return (char *)0x0;
      }
      uVar3 = uVar5 + uVar3 * 10;
      szDataPtr = (char *)((byte *)szDataPtr + 1);
      lVar4 = lVar4 + -1;
      pbVar2 = (byte *)szDataEnd;
    } while (lVar4 != 0);
  }
  *PtrValue = uVar3;
  return (char *)pbVar2;
}

Assistant:

static const char * CaptureDecimalInteger(const char * szDataPtr, const char * szDataEnd, PDWORD PtrValue)
{
    DWORD TotalValue = 0;
    DWORD AddValue = 0;

    // Skip all spaces
    while (szDataPtr < szDataEnd && szDataPtr[0] == ' ')
        szDataPtr++;

    // Load the number
    while (szDataPtr < szDataEnd && szDataPtr[0] != ' ')
    {
        // Must only contain decimal digits ('0' - '9')
        if (!IsCharDigit(szDataPtr[0]))
            return NULL;

        // Get the next value and verify overflow
        AddValue = szDataPtr[0] - '0';
        if ((TotalValue + AddValue) < TotalValue)
            return NULL;

        TotalValue = (TotalValue * 10) + AddValue;
        szDataPtr++;
    }

    // Give the result
    PtrValue[0] = TotalValue;
    return szDataPtr;
}